

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

SourceCodeInfo_Location *
google::protobuf::Arena::CreateMaybeMessage<google::protobuf::SourceCodeInfo_Location>(Arena *arena)

{
  SourceCodeInfo_Location *this;
  
  if (arena == (Arena *)0x0) {
    this = (SourceCodeInfo_Location *)operator_new(0x70);
    SourceCodeInfo_Location::SourceCodeInfo_Location(this,(Arena *)0x0);
  }
  else {
    if (arena->hooks_cookie_ != (void *)0x0) {
      OnArenaAllocation(arena,(type_info *)&SourceCodeInfo_Location::typeinfo,0x70);
    }
    this = (SourceCodeInfo_Location *)AllocateAlignedNoHook(arena,0x70);
    SourceCodeInfo_Location::SourceCodeInfo_Location(this,arena);
  }
  return this;
}

Assistant:

PROTOBUF_NOINLINE PROTOBUF_NAMESPACE_ID::SourceCodeInfo_Location* Arena::CreateMaybeMessage< PROTOBUF_NAMESPACE_ID::SourceCodeInfo_Location >(Arena* arena) {
  return Arena::CreateMessageInternal< PROTOBUF_NAMESPACE_ID::SourceCodeInfo_Location >(arena);
}